

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

void __thiscall GLDrawList::SortSpriteIntoWall(GLDrawList *this,SortNode *head,SortNode *sort)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  GLDrawItem *pGVar5;
  GLWall *pGVar6;
  SortNode *pSVar7;
  uint uVar8;
  SortNode *pSVar9;
  GLSprite *pGVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  GLSprite s;
  GLSprite local_c0;
  
  pGVar5 = (this->drawitems).Array;
  iVar3 = pGVar5[head->itemindex].index;
  pGVar6 = (this->walls).Array;
  pGVar10 = (this->sprites).Array;
  iVar4 = pGVar5[sort->itemindex].index;
  fVar1 = pGVar10[iVar4].x1;
  fVar2 = pGVar10[iVar4].y1;
  fVar17 = pGVar6[iVar3].glseg.y1;
  fVar13 = pGVar6[iVar3].glseg.x1;
  fVar12 = pGVar6[iVar3].glseg.x2 - fVar13;
  fVar11 = (fVar2 - fVar17) * fVar12;
  fVar14 = pGVar6[iVar3].glseg.y2 - fVar17;
  fVar16 = (fVar1 - fVar13) * fVar14;
  fVar18 = fVar16 - fVar11;
  fVar17 = (pGVar10[iVar4].x2 - fVar13) * fVar14 + (fVar17 - pGVar10[iVar4].y2) * fVar12;
  if ((0.0005 <= ABS(fVar18)) || (0.0005 <= ABS(fVar17))) {
    if ((0.0005 <= fVar18) || (0.0005 <= fVar17)) {
      if ((fVar18 <= -0.0005) || (fVar17 <= -0.0005)) {
        fVar15 = pGVar10[iVar4].x2 - fVar1;
        fVar13 = pGVar10[iVar4].y2 - fVar2;
        fVar17 = (fVar11 - fVar16) / (fVar14 * fVar15 - fVar12 * fVar13);
        fVar1 = fVar15 * fVar17 + fVar1;
        pGVar10 = pGVar10 + iVar4;
        fVar2 = fVar13 * fVar17 + fVar2;
        fVar17 = (pGVar10->ur - pGVar10->ul) * fVar17 + pGVar10->ul;
        memcpy(&local_c0,pGVar10,0xa0);
        AddSprite(this,&local_c0);
        uVar8 = (this->sprites).Count - 1;
        pGVar10 = (this->sprites).Array;
        iVar3 = (this->drawitems).Array[sort->itemindex].index;
        pGVar10[iVar3].x2 = fVar1;
        pGVar10[uVar8].x1 = fVar1;
        pGVar10[iVar3].y2 = fVar2;
        pGVar10[uVar8].y1 = fVar2;
        pGVar10[iVar3].ur = fVar17;
        pGVar10[uVar8].ul = fVar17;
        pSVar9 = StaticSortNodeArray::GetNew(&SortNodes);
        *(undefined8 *)pSVar9 = 0;
        pSVar9->parent = (SortNode *)0x0;
        pSVar9->next = (SortNode *)0x0;
        pSVar9->left = (SortNode *)0x0;
        pSVar9->equal = (SortNode *)0x0;
        pSVar9->right = (SortNode *)0x0;
        pSVar9->itemindex = (this->drawitems).Count - 1;
        if (fVar18 <= 0.0) {
          pSVar7 = sort->parent;
          if (pSVar7 != (SortNode *)0x0) {
            pSVar7->next = sort->next;
          }
          if (sort->next != (SortNode *)0x0) {
            sort->next->parent = pSVar7;
          }
          sort->parent = (SortNode *)0x0;
          sort->next = (SortNode *)0x0;
          pSVar7 = head->left;
          if (pSVar7 != (SortNode *)0x0) {
            sort->parent = pSVar7->parent;
            pSVar7->parent = sort;
          }
          sort->next = pSVar7;
          if (sort->parent != (SortNode *)0x0) {
            sort->parent->next = sort;
          }
          head->left = sort;
          pSVar7 = pSVar9->parent;
          if (pSVar7 != (SortNode *)0x0) {
            pSVar7->next = pSVar9->next;
          }
          if (pSVar9->next != (SortNode *)0x0) {
            pSVar9->next->parent = pSVar7;
          }
          pSVar9->parent = (SortNode *)0x0;
          pSVar9->next = (SortNode *)0x0;
          pSVar7 = head->right;
          if (pSVar7 != (SortNode *)0x0) {
            pSVar9->parent = pSVar7->parent;
            pSVar7->parent = pSVar9;
          }
          pSVar9->next = pSVar7;
          if (pSVar9->parent != (SortNode *)0x0) {
            pSVar9->parent->next = pSVar9;
          }
          head->right = pSVar9;
          return;
        }
        pSVar7 = pSVar9->parent;
        if (pSVar7 != (SortNode *)0x0) {
          pSVar7->next = pSVar9->next;
        }
        if (pSVar9->next != (SortNode *)0x0) {
          pSVar9->next->parent = pSVar7;
        }
        pSVar9->parent = (SortNode *)0x0;
        pSVar9->next = (SortNode *)0x0;
        pSVar7 = head->left;
        if (pSVar7 != (SortNode *)0x0) {
          pSVar9->parent = pSVar7->parent;
          pSVar7->parent = pSVar9;
        }
        pSVar9->next = pSVar7;
        if (pSVar9->parent != (SortNode *)0x0) {
          pSVar9->parent->next = pSVar9;
        }
        head->left = pSVar9;
        pSVar9 = sort->parent;
        if (pSVar9 != (SortNode *)0x0) {
          pSVar9->next = sort->next;
        }
        if (sort->next != (SortNode *)0x0) {
          sort->next->parent = pSVar9;
        }
      }
      else {
        pSVar9 = sort->parent;
        if (pSVar9 != (SortNode *)0x0) {
          pSVar9->next = sort->next;
        }
        if (sort->next != (SortNode *)0x0) {
          sort->next->parent = pSVar9;
        }
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      pSVar9 = head->right;
      if (pSVar9 != (SortNode *)0x0) {
        sort->parent = pSVar9->parent;
        pSVar9->parent = sort;
      }
      sort->next = pSVar9;
      if (sort->parent != (SortNode *)0x0) {
        sort->parent->next = sort;
      }
      head->right = sort;
      return;
    }
    pSVar9 = sort->parent;
    if (pSVar9 != (SortNode *)0x0) {
      pSVar9->next = sort->next;
    }
    if (sort->next != (SortNode *)0x0) {
      sort->next->parent = pSVar9;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
  }
  else {
    pSVar9 = sort->parent;
    if (pGVar6[iVar3].type != '\x05') {
      if (pSVar9 != (SortNode *)0x0) {
        pSVar9->next = sort->next;
      }
      if (sort->next != (SortNode *)0x0) {
        sort->next->parent = pSVar9;
      }
      sort->parent = (SortNode *)0x0;
      sort->next = (SortNode *)0x0;
      sort->equal = head->equal;
      head->equal = sort;
      return;
    }
    if (pSVar9 != (SortNode *)0x0) {
      pSVar9->next = sort->next;
    }
    if (sort->next != (SortNode *)0x0) {
      sort->next->parent = pSVar9;
    }
    sort->parent = (SortNode *)0x0;
    sort->next = (SortNode *)0x0;
  }
  pSVar9 = head->left;
  if (pSVar9 != (SortNode *)0x0) {
    sort->parent = pSVar9->parent;
    pSVar9->parent = sort;
  }
  sort->next = pSVar9;
  if (sort->parent != (SortNode *)0x0) {
    sort->parent->next = sort;
  }
  head->left = sort;
  return;
}

Assistant:

void GLDrawList::SortSpriteIntoWall(SortNode * head,SortNode * sort)
{
	GLWall * wh=&walls[drawitems[head->itemindex].index];
	GLSprite * ss=&sprites[drawitems[sort->itemindex].index];
	GLSprite * ss1;

	float v1 = wh->PointOnSide(ss->x1, ss->y1);
	float v2 = wh->PointOnSide(ss->x2, ss->y2);

	if (fabs(v1)<MIN_EQ && fabs(v2)<MIN_EQ) 
	{
		if (wh->type==RENDERWALL_FOGBOUNDARY) 
		{
			head->AddToLeft(sort);
		}
		else 
		{
			head->AddToEqual(sort);
		}
	}
	else if (v1<MIN_EQ && v2<MIN_EQ) 
	{
		head->AddToLeft(sort);
	}
	else if (v1>-MIN_EQ && v2>-MIN_EQ) 
	{
		head->AddToRight(sort);
	}
	else
	{
		double r=ss->CalcIntersectionVertex(wh);

		float ix=(float)(ss->x1 + r * (ss->x2-ss->x1));
		float iy=(float)(ss->y1 + r * (ss->y2-ss->y1));
		float iu=(float)(ss->ul + r * (ss->ur-ss->ul));

		GLSprite s=*ss;
		AddSprite(&s);
		ss1=&sprites[sprites.Size()-1];
		ss=&sprites[drawitems[sort->itemindex].index];	// may have been reallocated!

		ss1->x1=ss->x2=ix;
		ss1->y1=ss->y2=iy;
		ss1->ul=ss->ur=iu;

		SortNode * sort2=SortNodes.GetNew();
		memset(sort2,0,sizeof(SortNode));
		sort2->itemindex=drawitems.Size()-1;

		if (v1>0)
		{
			head->AddToLeft(sort2);
			head->AddToRight(sort);
		}
		else
		{
			head->AddToLeft(sort);
			head->AddToRight(sort2);
		}
	}
}